

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SoftHSM.cpp
# Opt level: O0

CK_RV __thiscall
SoftHSM::generateDES
          (SoftHSM *this,CK_SESSION_HANDLE hSession,CK_ATTRIBUTE_PTR pTemplate,CK_ULONG ulCount,
          CK_OBJECT_HANDLE_PTR phKey,CK_BBOOL isOnToken,CK_BBOOL isPrivate)

{
  HandleManager *pHVar1;
  OSAttribute *this_00;
  int iVar2;
  uint uVar3;
  long *plVar4;
  CryptoFactory *pCVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ulong uVar6;
  ulong in_RCX;
  undefined8 *puVar7;
  long in_RDX;
  long *in_R8;
  bool bVar8;
  char in_stack_00000008;
  int in_stack_00000064;
  CK_OBJECT_HANDLE_PTR in_stack_00000068;
  CK_ULONG in_stack_00000070;
  CK_ATTRIBUTE_PTR in_stack_00000078;
  CK_SESSION_HANDLE in_stack_00000080;
  SoftHSM *in_stack_00000088;
  OSObject *oskey;
  ByteString kcv;
  ByteString value;
  bool bNeverExtractable;
  bool bAlwaysSensitive;
  CK_ULONG ulKeyGenMechanism;
  bool bOK;
  OSObject *osobject;
  CK_ULONG i_1;
  CK_ULONG keyAttribsCount;
  CK_ATTRIBUTE keyAttribs [32];
  CK_KEY_TYPE keyType;
  CK_OBJECT_CLASS objClass;
  CK_ULONG maxAttribs;
  CK_RV rv;
  RNG *rng;
  SymmetricAlgorithm *des;
  DESKey *key;
  CK_ULONG i;
  bool checkValue;
  Token *token;
  Session *session;
  undefined7 in_stack_fffffffffffff6a8;
  undefined1 in_stack_fffffffffffff6af;
  undefined6 in_stack_fffffffffffff6b0;
  undefined1 in_stack_fffffffffffff6b6;
  byte in_stack_fffffffffffff6b7;
  byte local_93a;
  byte local_929;
  ByteString *in_stack_fffffffffffff6d8;
  OSAttribute *in_stack_fffffffffffff6e0;
  char *in_stack_fffffffffffff6f0;
  HandleManager *in_stack_fffffffffffff6f8;
  undefined6 in_stack_fffffffffffff708;
  byte in_stack_fffffffffffff70e;
  byte in_stack_fffffffffffff70f;
  HandleManager *in_stack_fffffffffffff710;
  byte local_8d9;
  byte local_8c1;
  undefined1 *local_890;
  undefined1 local_858 [167];
  byte local_7b1;
  undefined1 local_7b0 [160];
  undefined1 local_710 [40];
  char local_6e8 [40];
  undefined1 local_6c0 [40];
  undefined1 local_698 [8];
  undefined1 local_668 [166];
  undefined1 local_5c2;
  byte local_5c1;
  undefined1 local_5c0 [166];
  byte local_51a;
  byte local_519;
  undefined1 local_518 [160];
  undefined8 local_478;
  byte local_469;
  undefined1 local_468 [167];
  byte local_3c1;
  HandleManager *local_3c0;
  ulong local_3b8;
  long local_3b0;
  undefined1 *local_3a8 [5];
  undefined8 local_380;
  undefined8 local_378;
  undefined1 *local_370;
  undefined8 local_368;
  undefined8 local_360;
  undefined8 *local_358;
  undefined8 local_350;
  undefined1 local_348 [672];
  undefined1 auStack_a8 [8];
  undefined8 local_a0;
  undefined8 local_98;
  undefined8 local_90;
  CK_RV local_88;
  long local_80;
  long *local_78;
  long *local_60;
  ulong local_58;
  byte local_49;
  OSAttribute *local_48;
  Session *local_40;
  undefined1 local_31;
  long *local_30;
  ulong local_28;
  long local_20;
  CK_RV local_8;
  
  *in_R8 = 0;
  local_30 = in_R8;
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_40 = (Session *)
             HandleManager::getSession
                       (in_stack_fffffffffffff6f8,(CK_SESSION_HANDLE)in_stack_fffffffffffff6f0);
  if (local_40 == (Session *)0x0) {
    local_8 = 0xb3;
  }
  else {
    local_48 = (OSAttribute *)Session::getToken(local_40);
    if (local_48 == (OSAttribute *)0x0) {
      local_8 = 5;
    }
    else {
      local_49 = 1;
      for (local_58 = 0; local_58 < local_28; local_58 = local_58 + 1) {
        if (*(long *)(local_20 + local_58 * 0x18) == 0x90) {
          if (*(long *)(local_20 + local_58 * 0x18 + 0x10) != 0) {
            softHSMLog(6,"generateDES",
                       "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/SoftHSM.cpp"
                       ,0x1ee1,"CKA_CHECK_VALUE must be a no-value (0 length) entry");
            return 0x13;
          }
          local_49 = 0;
        }
      }
      plVar4 = (long *)operator_new(0x38);
      DESKey::DESKey((DESKey *)
                     CONCAT17(in_stack_fffffffffffff6b7,
                              CONCAT16(in_stack_fffffffffffff6b6,in_stack_fffffffffffff6b0)),
                     CONCAT17(in_stack_fffffffffffff6af,in_stack_fffffffffffff6a8));
      local_60 = plVar4;
      pCVar5 = CryptoFactory::i();
      iVar2 = (**pCVar5->_vptr_CryptoFactory)(pCVar5,2);
      local_78 = (long *)CONCAT44(extraout_var,iVar2);
      if (local_78 == (long *)0x0) {
        softHSMLog(3,"generateDES",
                   "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/SoftHSM.cpp"
                   ,0x1ef0,"Could not get SymmetricAlgorithm");
        if (local_60 != (long *)0x0) {
          (**(code **)(*local_60 + 0x10))();
        }
        local_8 = 5;
      }
      else {
        pCVar5 = CryptoFactory::i();
        iVar2 = (*pCVar5->_vptr_CryptoFactory[8])(pCVar5,1);
        local_80 = CONCAT44(extraout_var_00,iVar2);
        if (local_80 == 0) {
          softHSMLog(3,"generateDES",
                     "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/SoftHSM.cpp"
                     ,0x1ef7,"Could not get RNG");
          (**(code **)(*local_78 + 0x50))(local_78,local_60);
          pCVar5 = CryptoFactory::i();
          (*pCVar5->_vptr_CryptoFactory[1])(pCVar5,local_78);
          local_8 = 5;
        }
        else {
          uVar6 = (**(code **)(*local_78 + 0x58))(local_78,local_60,local_80);
          if ((uVar6 & 1) == 0) {
            softHSMLog(3,"generateDES",
                       "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/SoftHSM.cpp"
                       ,0x1efe,"Could not generate DES secret key");
            (**(code **)(*local_78 + 0x50))(local_78,local_60);
            pCVar5 = CryptoFactory::i();
            (*pCVar5->_vptr_CryptoFactory[1])(pCVar5,local_78);
            local_8 = 5;
          }
          else {
            local_88 = 0;
            local_90 = 0x20;
            local_98 = 4;
            local_a0 = 0x13;
            memset(local_3a8,0,0x300);
            local_3a8[1] = (undefined1 *)&local_98;
            local_3a8[2] = (undefined1 *)0x8;
            local_3a8[3] = (undefined1 *)0x1;
            local_3a8[4] = &local_31;
            local_380 = 1;
            local_378 = 2;
            local_370 = &stack0x00000008;
            local_368 = 1;
            local_360 = 0x100;
            local_358 = &local_a0;
            local_350 = 8;
            local_890 = local_348;
            do {
              local_890 = local_890 + 0x18;
            } while (local_890 != auStack_a8);
            local_3b0 = 4;
            if (0x1c < local_28) {
              local_88 = 0xd1;
            }
            for (local_3b8 = 0; local_3b8 < local_28 && local_88 == 0; local_3b8 = local_3b8 + 1) {
              uVar6 = *(ulong *)(local_20 + local_3b8 * 0x18);
              if (((2 < uVar6) && (uVar6 != 0x90)) && (uVar6 != 0x100)) {
                puVar7 = (undefined8 *)(local_20 + local_3b8 * 0x18);
                local_3a8[local_3b0 * 3] = (undefined1 *)*puVar7;
                local_3a8[local_3b0 * 3 + 1] = (undefined1 *)puVar7[1];
                local_3a8[local_3b0 * 3 + 2] = (undefined1 *)puVar7[2];
                local_3b0 = local_3b0 + 1;
              }
            }
            if (local_88 == 0) {
              local_88 = CreateObject(in_stack_00000088,in_stack_00000080,in_stack_00000078,
                                      in_stack_00000070,in_stack_00000068,in_stack_00000064);
            }
            if (local_88 == 0) {
              local_3c0 = (HandleManager *)
                          HandleManager::getObject
                                    (in_stack_fffffffffffff6f8,
                                     (CK_OBJECT_HANDLE)in_stack_fffffffffffff6f0);
              if ((local_3c0 == (HandleManager *)0x0) ||
                 (uVar3 = (*local_3c0->_vptr_HandleManager[10])(), (uVar3 & 1) == 0)) {
                local_88 = 6;
              }
              else {
                uVar3 = (*local_3c0->_vptr_HandleManager[0xb])(local_3c0,1);
                pHVar1 = local_3c0;
                if ((uVar3 & 1) == 0) {
                  local_88 = 6;
                }
                else {
                  local_3c1 = 1;
                  local_469 = 0;
                  OSAttribute::OSAttribute
                            ((OSAttribute *)
                             CONCAT17(in_stack_fffffffffffff6b7,
                                      CONCAT16(in_stack_fffffffffffff6b6,in_stack_fffffffffffff6b0))
                             ,(bool)in_stack_fffffffffffff6af);
                  local_469 = 1;
                  iVar2 = (*pHVar1->_vptr_HandleManager[8])(pHVar1,0x163,local_468);
                  local_3c1 = (byte)iVar2 & 1;
                  if ((local_469 & 1) != 0) {
                    OSAttribute::~OSAttribute
                              ((OSAttribute *)
                               CONCAT17(in_stack_fffffffffffff6b7,
                                        CONCAT16(in_stack_fffffffffffff6b6,in_stack_fffffffffffff6b0
                                                )));
                  }
                  pHVar1 = local_3c0;
                  local_478 = 0x120;
                  local_519 = 0;
                  local_8c1 = 0;
                  if ((local_3c1 & 1) != 0) {
                    OSAttribute::OSAttribute
                              ((OSAttribute *)
                               CONCAT17(in_stack_fffffffffffff6b7,
                                        CONCAT16(in_stack_fffffffffffff6b6,in_stack_fffffffffffff6b0
                                                )),
                               CONCAT17(in_stack_fffffffffffff6af,in_stack_fffffffffffff6a8));
                    local_519 = 1;
                    iVar2 = (*pHVar1->_vptr_HandleManager[8])(pHVar1,0x166,local_518);
                    local_8c1 = (byte)iVar2;
                  }
                  local_3c1 = local_8c1 & 1;
                  if ((local_519 & 1) != 0) {
                    OSAttribute::~OSAttribute
                              ((OSAttribute *)
                               CONCAT17(in_stack_fffffffffffff6b7,
                                        CONCAT16(in_stack_fffffffffffff6b6,in_stack_fffffffffffff6b0
                                                )));
                  }
                  iVar2 = (*local_3c0->_vptr_HandleManager[4])(local_3c0,0x103,0);
                  local_51a = (byte)iVar2 & 1;
                  local_5c1 = 0;
                  local_8d9 = 0;
                  if ((local_3c1 & 1) != 0) {
                    in_stack_fffffffffffff710 = local_3c0;
                    OSAttribute::OSAttribute
                              ((OSAttribute *)
                               CONCAT17(in_stack_fffffffffffff6b7,
                                        CONCAT16(in_stack_fffffffffffff6b6,in_stack_fffffffffffff6b0
                                                )),(bool)in_stack_fffffffffffff6af);
                    local_5c1 = 1;
                    iVar2 = (*in_stack_fffffffffffff710->_vptr_HandleManager[8])
                                      (in_stack_fffffffffffff710,0x165,local_5c0);
                    local_8d9 = (byte)iVar2;
                  }
                  local_3c1 = local_8d9 & 1;
                  if ((local_5c1 & 1) != 0) {
                    OSAttribute::~OSAttribute
                              ((OSAttribute *)
                               CONCAT17(in_stack_fffffffffffff6b7,
                                        CONCAT16(in_stack_fffffffffffff6b6,in_stack_fffffffffffff6b0
                                                )));
                  }
                  uVar3 = (*local_3c0->_vptr_HandleManager[4])(local_3c0,0x162,0);
                  local_5c2 = (uVar3 & 1) == 0;
                  uVar3 = 0;
                  in_stack_fffffffffffff70f = 0;
                  if ((local_3c1 & 1) != 0) {
                    in_stack_fffffffffffff6f8 = local_3c0;
                    OSAttribute::OSAttribute
                              ((OSAttribute *)
                               CONCAT17(in_stack_fffffffffffff6b7,
                                        CONCAT16(in_stack_fffffffffffff6b6,in_stack_fffffffffffff6b0
                                                )),(bool)in_stack_fffffffffffff6af);
                    uVar3 = 0x1000000;
                    iVar2 = (*in_stack_fffffffffffff6f8->_vptr_HandleManager[8])
                                      (in_stack_fffffffffffff6f8,0x164,local_668);
                    in_stack_fffffffffffff70e = (byte)iVar2;
                    in_stack_fffffffffffff70f = in_stack_fffffffffffff70e;
                  }
                  local_3c1 = in_stack_fffffffffffff70f & 1;
                  if ((uVar3 & 0x1000000) != 0) {
                    OSAttribute::~OSAttribute
                              ((OSAttribute *)
                               CONCAT17(in_stack_fffffffffffff6b7,
                                        CONCAT16(in_stack_fffffffffffff6b6,in_stack_fffffffffffff6b0
                                                )));
                  }
                  ByteString::ByteString((ByteString *)0x17764b);
                  ByteString::ByteString((ByteString *)0x177658);
                  this_00 = local_48;
                  if (in_stack_00000008 == '\0') {
                    in_stack_fffffffffffff6d8 = (ByteString *)(**(code **)(*local_60 + 0x20))();
                    ByteString::operator=
                              ((ByteString *)
                               CONCAT17(in_stack_fffffffffffff6b7,
                                        CONCAT16(in_stack_fffffffffffff6b6,in_stack_fffffffffffff6b0
                                                )),
                               (ByteString *)
                               CONCAT17(in_stack_fffffffffffff6af,in_stack_fffffffffffff6a8));
                    (**(code **)(*local_60 + 0x28))(local_710);
                    ByteString::operator=
                              ((ByteString *)
                               CONCAT17(in_stack_fffffffffffff6b7,
                                        CONCAT16(in_stack_fffffffffffff6b6,in_stack_fffffffffffff6b0
                                                )),
                               (ByteString *)
                               CONCAT17(in_stack_fffffffffffff6af,in_stack_fffffffffffff6a8));
                    ByteString::~ByteString((ByteString *)0x177887);
                  }
                  else {
                    in_stack_fffffffffffff6f0 = (char *)(**(code **)(*local_60 + 0x20))();
                    Token::encrypt((Token *)this_00,in_stack_fffffffffffff6f0,(int)local_698);
                    in_stack_fffffffffffff6e0 = local_48;
                    (**(code **)(*local_60 + 0x28))(local_6e8);
                    Token::encrypt((Token *)in_stack_fffffffffffff6e0,local_6e8,(int)local_6c0);
                    ByteString::~ByteString((ByteString *)0x1776f7);
                  }
                  pHVar1 = local_3c0;
                  local_7b1 = 0;
                  local_929 = 0;
                  if ((local_3c1 & 1) != 0) {
                    OSAttribute::OSAttribute(in_stack_fffffffffffff6e0,in_stack_fffffffffffff6d8);
                    local_7b1 = 1;
                    iVar2 = (*pHVar1->_vptr_HandleManager[8])(pHVar1,0x11,local_7b0);
                    local_929 = (byte)iVar2;
                  }
                  local_3c1 = local_929 & 1;
                  if ((local_7b1 & 1) != 0) {
                    OSAttribute::~OSAttribute
                              ((OSAttribute *)
                               CONCAT17(in_stack_fffffffffffff6b7,
                                        CONCAT16(in_stack_fffffffffffff6b6,in_stack_fffffffffffff6b0
                                                )));
                  }
                  pHVar1 = local_3c0;
                  if ((local_49 & 1) != 0) {
                    bVar8 = (local_3c1 & 1) != 0;
                    local_93a = 0;
                    if (bVar8) {
                      OSAttribute::OSAttribute(in_stack_fffffffffffff6e0,in_stack_fffffffffffff6d8);
                      iVar2 = (*pHVar1->_vptr_HandleManager[8])(pHVar1,0x90,local_858);
                      in_stack_fffffffffffff6b7 = (byte)iVar2;
                      local_93a = in_stack_fffffffffffff6b7;
                    }
                    local_3c1 = local_93a & 1;
                    if (bVar8) {
                      OSAttribute::~OSAttribute
                                ((OSAttribute *)
                                 CONCAT17(in_stack_fffffffffffff6b7,
                                          CONCAT16(in_stack_fffffffffffff6b6,
                                                   in_stack_fffffffffffff6b0)));
                    }
                  }
                  if ((local_3c1 & 1) == 0) {
                    (*local_3c0->_vptr_HandleManager[0xd])();
                  }
                  else {
                    iVar2 = (*local_3c0->_vptr_HandleManager[0xc])();
                    local_3c1 = (byte)iVar2 & 1;
                  }
                  if ((local_3c1 & 1) == 0) {
                    local_88 = 6;
                  }
                  ByteString::~ByteString((ByteString *)0x177ab6);
                  ByteString::~ByteString((ByteString *)0x177ac3);
                }
              }
            }
            (**(code **)(*local_78 + 0x50))(local_78,local_60);
            pCVar5 = CryptoFactory::i();
            (*pCVar5->_vptr_CryptoFactory[1])(pCVar5,local_78);
            if ((local_88 != 0) && (*local_30 != 0)) {
              plVar4 = (long *)HandleManager::getObject
                                         (in_stack_fffffffffffff6f8,
                                          (CK_OBJECT_HANDLE)in_stack_fffffffffffff6f0);
              HandleManager::destroyObject
                        (in_stack_fffffffffffff710,
                         CONCAT17(in_stack_fffffffffffff70f,
                                  CONCAT16(in_stack_fffffffffffff70e,in_stack_fffffffffffff708)));
              if (plVar4 != (long *)0x0) {
                (**(code **)(*plVar4 + 0x70))();
              }
              *local_30 = 0;
            }
            local_8 = local_88;
          }
        }
      }
    }
  }
  return local_8;
}

Assistant:

CK_RV SoftHSM::generateDES
(CK_SESSION_HANDLE hSession,
	CK_ATTRIBUTE_PTR pTemplate,
	CK_ULONG ulCount,
	CK_OBJECT_HANDLE_PTR phKey,
	CK_BBOOL isOnToken,
	CK_BBOOL isPrivate)
{
	*phKey = CK_INVALID_HANDLE;

	// Get the session
	Session* session = (Session*)handleManager->getSession(hSession);
	if (session == NULL)
		return CKR_SESSION_HANDLE_INVALID;

	// Get the token
	Token* token = session->getToken();
	if (token == NULL)
		return CKR_GENERAL_ERROR;

	// Extract desired parameter information
	bool checkValue = true;
	for (CK_ULONG i = 0; i < ulCount; i++)
	{
		switch (pTemplate[i].type)
		{
			case CKA_CHECK_VALUE:
				if (pTemplate[i].ulValueLen > 0)
				{
					INFO_MSG("CKA_CHECK_VALUE must be a no-value (0 length) entry");
					return CKR_ATTRIBUTE_VALUE_INVALID;
				}
				checkValue = false;
				break;
			default:
				break;
		}
	}

	// Generate the secret key
	DESKey* key = new DESKey(56);
	SymmetricAlgorithm* des = CryptoFactory::i()->getSymmetricAlgorithm(SymAlgo::DES);
	if (des == NULL)
	{
		ERROR_MSG("Could not get SymmetricAlgorithm");
		delete key;
		return CKR_GENERAL_ERROR;
	}
	RNG* rng = CryptoFactory::i()->getRNG();
	if (rng == NULL)
	{
		ERROR_MSG("Could not get RNG");
		des->recycleKey(key);
		CryptoFactory::i()->recycleSymmetricAlgorithm(des);
		return CKR_GENERAL_ERROR;
	}
	if (!des->generateKey(*key, rng))
	{
		ERROR_MSG("Could not generate DES secret key");
		des->recycleKey(key);
		CryptoFactory::i()->recycleSymmetricAlgorithm(des);
		return CKR_GENERAL_ERROR;
	}

	CK_RV rv = CKR_OK;

	// Create the secret key object using C_CreateObject
	const CK_ULONG maxAttribs = 32;
	CK_OBJECT_CLASS objClass = CKO_SECRET_KEY;
	CK_KEY_TYPE keyType = CKK_DES;
	CK_ATTRIBUTE keyAttribs[maxAttribs] = {
		{ CKA_CLASS, &objClass, sizeof(objClass) },
		{ CKA_TOKEN, &isOnToken, sizeof(isOnToken) },
		{ CKA_PRIVATE, &isPrivate, sizeof(isPrivate) },
		{ CKA_KEY_TYPE, &keyType, sizeof(keyType) },
	};
	CK_ULONG keyAttribsCount = 4;

	// Add the additional
	if (ulCount > (maxAttribs - keyAttribsCount))
		rv = CKR_TEMPLATE_INCONSISTENT;
	for (CK_ULONG i=0; i < ulCount && rv == CKR_OK; ++i)
	{
		switch (pTemplate[i].type)
		{
			case CKA_CLASS:
			case CKA_TOKEN:
			case CKA_PRIVATE:
			case CKA_KEY_TYPE:
			case CKA_CHECK_VALUE:
				continue;
		default:
			keyAttribs[keyAttribsCount++] = pTemplate[i];
		}
	}

	if (rv == CKR_OK)
		rv = this->CreateObject(hSession, keyAttribs, keyAttribsCount, phKey,OBJECT_OP_GENERATE);

	// Store the attributes that are being supplied
	if (rv == CKR_OK)
	{
		OSObject* osobject = (OSObject*)handleManager->getObject(*phKey);
		if (osobject == NULL_PTR || !osobject->isValid()) {
			rv = CKR_FUNCTION_FAILED;
		} else if (osobject->startTransaction()) {
			bool bOK = true;

			// Common Attributes
			bOK = bOK && osobject->setAttribute(CKA_LOCAL,true);
			CK_ULONG ulKeyGenMechanism = (CK_ULONG)CKM_DES_KEY_GEN;
			bOK = bOK && osobject->setAttribute(CKA_KEY_GEN_MECHANISM,ulKeyGenMechanism);

			// Common Secret Key Attributes
			bool bAlwaysSensitive = osobject->getBooleanValue(CKA_SENSITIVE, false);
			bOK = bOK && osobject->setAttribute(CKA_ALWAYS_SENSITIVE,bAlwaysSensitive);
			bool bNeverExtractable = osobject->getBooleanValue(CKA_EXTRACTABLE, false) == false;
			bOK = bOK && osobject->setAttribute(CKA_NEVER_EXTRACTABLE, bNeverExtractable);

			// DES Secret Key Attributes
			ByteString value;
			ByteString kcv;
			if (isPrivate)
			{
				token->encrypt(key->getKeyBits(), value);
				token->encrypt(key->getKeyCheckValue(), kcv);
			}
			else
			{
				value = key->getKeyBits();
				kcv = key->getKeyCheckValue();
			}
			bOK = bOK && osobject->setAttribute(CKA_VALUE, value);
			if (checkValue)
				bOK = bOK && osobject->setAttribute(CKA_CHECK_VALUE, kcv);

			if (bOK)
				bOK = osobject->commitTransaction();
			else
				osobject->abortTransaction();

			if (!bOK)
				rv = CKR_FUNCTION_FAILED;
		} else
			rv = CKR_FUNCTION_FAILED;
	}

	// Clean up
	des->recycleKey(key);
	CryptoFactory::i()->recycleSymmetricAlgorithm(des);

	// Remove the key that may have been created already when the function fails.
	if (rv != CKR_OK)
	{
		if (*phKey != CK_INVALID_HANDLE)
		{
			OSObject* oskey = (OSObject*)handleManager->getObject(*phKey);
			handleManager->destroyObject(*phKey);
			if (oskey) oskey->destroyObject();
			*phKey = CK_INVALID_HANDLE;
		}
	}

	return rv;
}